

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_interface.cpp
# Opt level: O0

int isotree_impute(void *isotree_model,size_t nrows,uint8_t is_col_major,double *numeric_data,
                  int *categ_data,double *csr_values,int *csr_indices,int *csr_indptr)

{
  ostream *this;
  long in_RDI;
  exception *e;
  size_t in_stack_00000020;
  IsolationForest *model;
  undefined7 in_stack_00000048;
  IsolationForest *in_stack_00000060;
  size_t in_stack_00000080;
  int local_4;
  
  if (in_RDI == 0) {
    this = std::operator<<((ostream *)&std::cerr,
                           "Passed NULL \'isotree_model\' to \'isotree_impute\'.");
    std::ostream::operator<<((ostream *)this,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
  }
  else {
    if (e == (exception *)0x0) {
      isotree::IsolationForest::impute
                ((IsolationForest *)numeric_data,(double *)categ_data,(int *)csr_values,model._7_1_,
                 in_stack_00000020);
    }
    else {
      isotree::IsolationForest::impute
                (in_stack_00000060,(double *)isotree_model,(int *)nrows,
                 (int *)CONCAT17(is_col_major,in_stack_00000048),(int *)numeric_data,
                 categ_data._7_1_,in_stack_00000080);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

ISOTREE_EXPORTED
int isotree_impute
(
    void *isotree_model,
    size_t nrows,
    uint8_t is_col_major,
    double *numeric_data,
    int *categ_data,
    double *csr_values,
    int *csr_indices,
    int *csr_indptr
)
{
    if (!isotree_model) {
        cerr << "Passed NULL 'isotree_model' to 'isotree_impute'." << std::endl;
        return IsoTreeError;
    }

    IsolationForest *model = (IsolationForest*)isotree_model;

    try
    {
        if (!csr_indptr) {
            model->impute(numeric_data, categ_data, (bool) is_col_major, nrows);
        }

        else {
            model->impute(csr_values, csr_indices, csr_indptr,
                          categ_data, (bool) is_col_major, nrows);
        }

        return IsoTreeSuccess;
    }

    catch (std::exception &e)
    {
        cerr << e.what();
        cerr.flush();
    }

    return IsoTreeError;
}